

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interaction.h
# Opt level: O2

void __thiscall
pbrt::SurfaceInteraction::SetShadingGeometry
          (SurfaceInteraction *this,Normal3f *ns,Vector3f *dpdus,Vector3f *dpdvs,Normal3f *dndus,
          Normal3f *dndvs,bool orientationIsAuthoritative)

{
  Normal3f *n2;
  undefined8 uVar1;
  long lVar2;
  anon_struct_60_5_be74bf41_for_shading *n;
  undefined1 auVar3 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  float fVar7;
  undefined1 auVar8 [16];
  Normal3<float> NVar9;
  undefined1 auVar6 [56];
  
  auVar6 = in_ZMM0._8_56_;
  n = &this->shading;
  n2 = &(this->super_Interaction).n;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.z =
       (ns->super_Tuple3<pbrt::Normal3,_float>).z;
  fVar7 = (ns->super_Tuple3<pbrt::Normal3,_float>).y;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.x =
       (ns->super_Tuple3<pbrt::Normal3,_float>).x;
  (this->shading).n.super_Tuple3<pbrt::Normal3,_float>.y = fVar7;
  if (orientationIsAuthoritative) {
    NVar9 = FaceForward<float>(n2,&n->n);
    fVar7 = NVar9.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar4._0_8_ = NVar9.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar4._8_56_ = auVar6;
    auVar3 = auVar4._0_16_;
    lVar2 = 0x30;
    n = (anon_struct_60_5_be74bf41_for_shading *)n2;
  }
  else {
    NVar9 = FaceForward<float>(&n->n,n2);
    fVar7 = NVar9.super_Tuple3<pbrt::Normal3,_float>.z;
    auVar5._0_8_ = NVar9.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    auVar5._8_56_ = auVar6;
    auVar3 = auVar5._0_16_;
    lVar2 = 0x88;
  }
  uVar1 = vmovlps_avx(auVar3);
  (n->n).super_Tuple3<pbrt::Normal3,_float>.x = (float)(int)uVar1;
  (n->n).super_Tuple3<pbrt::Normal3,_float>.y = (float)(int)((ulong)uVar1 >> 0x20);
  *(float *)((long)&(this->super_Interaction).pi.super_Point3<pbrt::Interval<float>_>.
                    super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.x.low + lVar2) = fVar7;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z =
       (dpdus->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar7 = (dpdus->super_Tuple3<pbrt::Vector3,_float>).y;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x =
       (dpdus->super_Tuple3<pbrt::Vector3,_float>).x;
  (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y = fVar7;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z =
       (dpdvs->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar7 = (dpdvs->super_Tuple3<pbrt::Vector3,_float>).y;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x =
       (dpdvs->super_Tuple3<pbrt::Vector3,_float>).x;
  (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y = fVar7;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.z =
       (dndus->super_Tuple3<pbrt::Normal3,_float>).z;
  fVar7 = (dndus->super_Tuple3<pbrt::Normal3,_float>).y;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.x =
       (dndus->super_Tuple3<pbrt::Normal3,_float>).x;
  (this->shading).dndu.super_Tuple3<pbrt::Normal3,_float>.y = fVar7;
  fVar7 = (dndvs->super_Tuple3<pbrt::Normal3,_float>).y;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.x =
       (dndvs->super_Tuple3<pbrt::Normal3,_float>).x;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.y = fVar7;
  (this->shading).dndv.super_Tuple3<pbrt::Normal3,_float>.z =
       (dndvs->super_Tuple3<pbrt::Normal3,_float>).z;
  do {
    fVar7 = (this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.y;
    auVar3 = ZEXT416((uint)(this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.x);
    auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar3,auVar3);
    auVar8 = ZEXT416((uint)(this->shading).dpdu.super_Tuple3<pbrt::Vector3,_float>.z);
    auVar3 = vfmadd213ss_fma(auVar8,auVar8,auVar3);
    if (auVar3._0_4_ <= 1e+16) {
      fVar7 = (this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.y;
      auVar3 = ZEXT416((uint)(this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.x);
      auVar3 = vfmadd231ss_fma(ZEXT416((uint)(fVar7 * fVar7)),auVar3,auVar3);
      auVar8 = ZEXT416((uint)(this->shading).dpdv.super_Tuple3<pbrt::Vector3,_float>.z);
      auVar3 = vfmadd213ss_fma(auVar8,auVar8,auVar3);
      if (auVar3._0_4_ <= 1e+16) {
        return;
      }
    }
    Tuple3<pbrt::Vector3,float>::operator/=
              ((Tuple3<pbrt::Vector3,float> *)&(this->shading).dpdu,1e+08);
    Tuple3<pbrt::Vector3,float>::operator/=
              ((Tuple3<pbrt::Vector3,float> *)&(this->shading).dpdv,1e+08);
  } while( true );
}

Assistant:

PBRT_CPU_GPU
    void SetShadingGeometry(const Normal3f &ns, const Vector3f &dpdus,
                            const Vector3f &dpdvs, const Normal3f &dndus,
                            const Normal3f &dndvs, bool orientationIsAuthoritative) {
        // Compute _shading.n_ for _SurfaceInteraction_
        shading.n = ns;
        DCHECK_NE(shading.n, Normal3f(0, 0, 0));
        if (orientationIsAuthoritative)
            n = FaceForward(n, shading.n);
        else
            shading.n = FaceForward(shading.n, n);

        // Initialize _shading_ partial derivative values
        shading.dpdu = dpdus;
        shading.dpdv = dpdvs;
        shading.dndu = dndus;
        shading.dndv = dndvs;
        while (LengthSquared(shading.dpdu) > 1e16f ||
               LengthSquared(shading.dpdv) > 1e16f) {
            shading.dpdu /= 1e8f;
            shading.dpdv /= 1e8f;
        }
    }